

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O1

void __thiscall libDAI::MaxPlus::MaxPlus(MaxPlus *this,FactorGraph *fg,Properties *opts,size_t k)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *this_01;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar5;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  Var *n;
  undefined4 extraout_var_08;
  VarSet *ns;
  Exception *this_02;
  ulong uVar6;
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var_09 [56];
  vector<unsigned_long,_std::allocator<unsigned_long>_> ind;
  Index indi;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  undefined1 local_a0 [32];
  pointer local_80;
  pointer local_70;
  pointer local_68;
  pointer local_58;
  VarSet local_50;
  undefined1 auVar7 [64];
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG,fg,opts);
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_005e8908;
  this_00 = &this->_indices;
  this_01 = &this->_messages;
  *(undefined8 *)&this->Props = 0;
  (this->Props).tol = 0.0;
  (this->Props).maxiter = 0;
  (this->Props).verbose = 0;
  (this->Props).damping = 0.0;
  this->_maxdiff = 0.0;
  this->_iterations = 0;
  (this->_indices).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_indices).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_indices).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_g = fg;
  iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->bestConfiguration,CONCAT44(extraout_var,iVar4),(allocator_type *)local_a0);
  this->_k = k;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_valConfs;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_valConfs;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->_k_th_Val = -1.79769313486232e+308;
  this->writeAnyTimeResults = false;
  this->results_f = (ofstream *)0x0;
  this->timings_f = (ofstream *)0x0;
  iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])(this);
  if ((char)iVar4 != '\0') {
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::_M_erase_at_end
              (this_01,(this->_messages).
                       super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::reserve
              (this_01,*(long *)(CONCAT44(extraout_var_00,iVar4) + 0x48) -
                       *(long *)(CONCAT44(extraout_var_00,iVar4) + 0x40) >> 4);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::_M_erase_at_end(this_00,(this->_indices).
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::reserve(this_00,*(long *)(CONCAT44(extraout_var_01,iVar4) + 0x48) -
                      *(long *)(CONCAT44(extraout_var_01,iVar4) + 0x40) >> 4);
    uVar6 = 0;
    while( true ) {
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      if ((ulong)(*(long *)(CONCAT44(extraout_var_02,iVar4) + 0x48) -
                  *(long *)(CONCAT44(extraout_var_02,iVar4) + 0x40) >> 4) <= uVar6) break;
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      uVar1 = *(undefined8 *)(*(long *)(CONCAT44(extraout_var_03,iVar4) + 0x40) + uVar6 * 0x10);
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      uVar2 = *(undefined8 *)(*(long *)(CONCAT44(extraout_var_04,iVar4) + 0x40) + 8 + uVar6 * 0x10);
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x30))
                        ((long *)CONCAT44(extraout_var_05,iVar4),uVar1);
      auVar7._8_56_ = extraout_var_09;
      auVar7._0_8_ = extraout_XMM1_Qa;
      auVar3 = vcvtusi2sd_avx512f(auVar7._0_16_,*(size_type *)(lVar5 + 8));
      local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(1.0 / auVar3._0_8_);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_a0,*(size_type *)(lVar5 + 8),
                 (value_type_conflict3 *)&local_50,(allocator_type *)&local_b8);
      std::vector<libDAI::TProb<double>,std::allocator<libDAI::TProb<double>>>::
      emplace_back<libDAI::TProb<double>>
                ((vector<libDAI::TProb<double>,std::allocator<libDAI::TProb<double>>> *)this_01,
                 (TProb<double> *)local_a0);
      if ((pointer)local_a0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ - local_a0._0_8_);
      }
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0x50))
                        ((long *)CONCAT44(extraout_var_06,iVar4),uVar2);
      local_a0._0_8_ = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_b8,*(long *)(lVar5 + 0x28) - *(long *)(lVar5 + 0x20) >> 3,
                 (value_type_conflict2 *)local_a0,(allocator_type *)&local_50);
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      n = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0x30))
                           ((long *)CONCAT44(extraout_var_07,iVar4),uVar1);
      VarSet::VarSet(&local_50,n);
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      ns = (VarSet *)
           (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x50))
                     ((long *)CONCAT44(extraout_var_08,iVar4),uVar2);
      Index::Index((Index *)local_a0,&local_50,ns);
      if (local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_50._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (-1 < (long)local_a0._0_8_) {
        lVar5 = 0;
        do {
          *(undefined8 *)
           ((long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start + lVar5) = local_a0._0_8_;
          Index::operator++((Index *)local_a0);
          lVar5 = lVar5 + 8;
        } while (-1 < (long)local_a0._0_8_);
      }
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back(this_00,&local_b8);
      if (local_68 != (pointer)0x0) {
        operator_delete(local_68,(long)local_58 - (long)local_68);
      }
      if (local_80 != (pointer)0x0) {
        operator_delete(local_80,(long)local_70 - (long)local_80);
      }
      if ((pointer)local_a0._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a0._8_8_,local_a0._24_8_ - local_a0._8_8_);
      }
      if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar6 = uVar6 + 1;
    }
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator=
              (&this->_newmessages,this_01);
    return;
  }
  this_02 = (Exception *)__cxa_allocate_exception(0x10);
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"maxplus.cpp, line 93","");
  Exception::Exception(this_02,8,(string *)local_a0);
  __cxa_throw(this_02,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

MaxPlus::MaxPlus(const FactorGraph & fg, const Properties &opts, size_t k ) 
        : 
            DAIAlgFG(fg, opts), Props(), _maxdiff(0.0), _iterations(0UL), 
            _indices(), _messages(), _newmessages(),
            _g(&fg) , bestConfiguration( fg.nrVars() ), 
            _k(k),
            _k_th_Val(-DBL_MAX),
            writeAnyTimeResults(false), results_f(NULL), timings_f(NULL)
    {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        // clear messages
        _messages.clear();
        _messages.reserve(grm().nrEdges());

        // clear indices
        _indices.clear();
        _indices.reserve(grm().nrEdges());

        // create messages and indices
        for( size_t iI = 0; iI < grm().nrEdges(); iI++ ) {
            size_t i = grm().edge(iI).first;
            size_t I = grm().edge(iI).second;

            _messages.push_back( Prob( grm().var(i).states() ) );

            vector<size_t> ind( grm().factor(I).stateSpace(), 0 );
            Index indi (grm().var(i), grm().factor(I).vars() );
            for( size_t j = 0; indi >= 0; ++indi,++j )
                ind[j] = indi; 
            _indices.push_back( ind );
        }

        // create new_messages
        _newmessages = _messages;
    }